

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_struct_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  char *__s;
  ulong uVar5;
  char *pcVar6;
  size_t __n;
  
  uVar3 = id * 2 + 4;
  if ((uVar3 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar3), uVar5 != 0)) {
    pvVar2 = td->table;
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = ',';
    }
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = '{';
    (*pf)(ctx,(void *)(uVar5 + (long)pvVar2));
    pcVar6 = ctx->p;
    if (ctx->indent != '\0') {
      ctx->p = pcVar6 + 1;
      *pcVar6 = '\n';
      lVar4 = (long)ctx->level + -1;
      ctx->level = (int)lVar4;
      uVar5 = (ulong)ctx->indent * lVar4;
      pcVar6 = ctx->pflush;
      __s = ctx->p;
      if (pcVar6 < __s + uVar5) {
        if (pcVar6 <= __s) {
          (*ctx->flush)(ctx,0);
          pcVar6 = ctx->pflush;
          __s = ctx->p;
        }
        __n = (long)pcVar6 - (long)__s;
        if (__n < uVar5) {
          do {
            memset(__s,0x20,__n);
            ctx->p = ctx->p + __n;
            uVar5 = uVar5 - __n;
            (*ctx->flush)(ctx,0);
            __s = ctx->p;
            __n = (long)ctx->pflush - (long)__s;
          } while (__n < uVar5);
        }
      }
      memset(__s,0x20,uVar5);
      pcVar6 = ctx->p + uVar5;
    }
    ctx->p = pcVar6 + 1;
    *pcVar6 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_struct_f *pf)
{
    const void *p = get_field_ptr(td, id);

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_start('{');
        pf(ctx, p);
        print_end('}');
    }
}